

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferTestUtil.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  allocator<tcu::Vector<float,_3>_> *this_00;
  GLuint GVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 program;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  reference pvVar7;
  reference pvVar8;
  reference src;
  reference src_00;
  TestContext *this_01;
  TestLog *log;
  char *imageSetDesc_00;
  undefined8 extraout_RAX;
  int iVar9;
  int iVar10;
  int local_308;
  int local_274;
  int local_26c;
  int local_234;
  PixelBufferAccess local_230;
  PixelBufferAccess local_208;
  int local_1dc;
  string local_1d8;
  int local_1b4;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string imageSetDesc;
  int curOffset;
  int numBytesToVerify;
  bool isLeftoverBatch;
  int numRemaining;
  undefined1 local_f0 [3];
  bool isOk;
  int numVerified;
  Surface referenceImg;
  Surface indexBufferImg;
  undefined1 local_b8 [8];
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fetchedColor;
  allocator<tcu::Vector<float,_2>_> local_89;
  undefined1 local_88 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> fetchedPos;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  RGBA threshold;
  int minBytesPerBatch;
  int viewportH;
  int viewportW;
  RenderTarget *renderTarget;
  int numBytes_local;
  int offset_local;
  deUint8 *refPtr_local;
  deUint32 buffer_local;
  IndexArrayVerifier *this_local;
  
  iVar9 = (int)siglen;
  iVar10 = (int)tbs;
  pRVar6 = gles2::Context::getRenderContext((this->super_BufferVerifierBase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[4])();
  iVar5 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar5 = de::min<int>(0x80,iVar5);
  iVar4 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var,iVar4));
  iVar4 = de::min<int>(0x80,iVar4);
  positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  tcu::RGBA::RGBA((RGBA *)&positions.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_89);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_88,0x81
             ,&local_89);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_89);
  this_00 = (allocator<tcu::Vector<float,_3>_> *)((long)&indexBufferImg.m_pixels.m_cap + 7);
  std::allocator<tcu::Vector<float,_3>_>::allocator(this_00);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8,0x81
             ,this_00);
  std::allocator<tcu::Vector<float,_3>_>::~allocator
            ((allocator<tcu::Vector<float,_3>_> *)((long)&indexBufferImg.m_pixels.m_cap + 7));
  tcu::Surface::Surface((Surface *)&referenceImg.m_pixels.m_cap,iVar5,iVar4);
  tcu::Surface::Surface((Surface *)local_f0,iVar5,iVar4);
  numRemaining = 0;
  isLeftoverBatch = true;
  computeIndexVerifierPositions
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  computeIndexVerifierColors
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glBindBuffer(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8892,0)
  ;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0,0,iVar5,iVar4);
  glu::CallLogWrapper::glClearColor
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0.0,0.0,0.0,1.0);
  program = glu::ShaderProgram::getProgram(this->m_program);
  glu::CallLogWrapper::glUseProgram(&(this->super_BufferVerifierBase).super_CallLogWrapper,program);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(&(this->super_BufferVerifierBase).super_CallLogWrapper,0xbe2);
  glu::CallLogWrapper::glBlendFunc(&(this->super_BufferVerifierBase).super_CallLogWrapper,1,1);
  glu::CallLogWrapper::glBlendEquation
            (&(this->super_BufferVerifierBase).super_CallLogWrapper,0x8006);
  do {
    if (iVar10 <= numRemaining) break;
    local_308 = iVar10 - numRemaining;
    bVar2 = 1 < local_308;
    if (bVar2) {
      local_26c = de::min<int>(0x81,local_308);
    }
    else {
      local_26c = 2;
    }
    imageSetDesc.field_2._12_4_ = local_26c;
    if (bVar2) {
      local_274 = numRemaining;
    }
    else {
      local_274 = iVar10 + -2;
    }
    imageSetDesc.field_2._8_4_ = local_274;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"Bytes ",&local_189);
    local_1b4 = iVar9 + imageSetDesc.field_2._8_4_;
    de::toString<int>(&local_1b0,&local_1b4);
    std::operator+(&local_168,&local_188,&local_1b0);
    std::operator+(&local_148,&local_168," to ");
    local_1dc = imageSetDesc.field_2._12_4_ + -1 + iVar9 + imageSetDesc.field_2._8_4_;
    de::toString<int>(&local_1d8,&local_1dc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_148,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator(&local_189);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    GVar1 = this->m_posLoc;
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        &colors.
                         super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,GVar1,2,0x1406,'\0',0,pvVar7);
    GVar1 = this->m_colorLoc;
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        &fetchedPos.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,GVar1,3,0x1406,'\0',0,pvVar8);
    glu::CallLogWrapper::glDrawElements
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,3,imageSetDesc.field_2._12_4_,
               0x1401,(void *)(long)(iVar9 + imageSetDesc.field_2._8_4_));
    pRVar6 = gles2::Context::getRenderContext((this->super_BufferVerifierBase).m_context);
    tcu::Surface::getAccess(&local_208,(Surface *)&referenceImg.m_pixels.m_cap);
    glu::readPixels(pRVar6,0,0,&local_208);
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_88,0);
    src = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                    ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                     &colors.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    execVertexFetch<tcu::Vector<float,2>>
              (pvVar7,src,sig + (long)(int)imageSetDesc.field_2._8_4_ + (long)iVar9,
               imageSetDesc.field_2._12_4_);
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_b8,0);
    src_00 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        &fetchedPos.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    execVertexFetch<tcu::Vector<float,3>>
              (pvVar8,src_00,sig + (long)(int)imageSetDesc.field_2._8_4_ + (long)iVar9,
               imageSetDesc.field_2._12_4_);
    glu::CallLogWrapper::glClear(&(this->super_BufferVerifierBase).super_CallLogWrapper,0x4000);
    GVar1 = this->m_posLoc;
    pvVar7 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_88,0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,GVar1,2,0x1406,'\0',0,pvVar7);
    GVar1 = this->m_colorLoc;
    pvVar8 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::operator[]
                       ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                        local_b8,0);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,GVar1,3,0x1406,'\0',0,pvVar8);
    glu::CallLogWrapper::glDrawArrays
              (&(this->super_BufferVerifierBase).super_CallLogWrapper,3,0,
               imageSetDesc.field_2._12_4_);
    pRVar6 = gles2::Context::getRenderContext((this->super_BufferVerifierBase).m_context);
    tcu::Surface::getAccess(&local_230,(Surface *)local_f0);
    glu::readPixels(pRVar6,0,0,&local_230);
    this_01 = gles2::Context::getTestContext((this->super_BufferVerifierBase).m_context);
    log = tcu::TestContext::getLog(this_01);
    imageSetDesc_00 = (char *)std::__cxx11::string::c_str();
    bVar3 = tcu::pixelThresholdCompare
                      (log,"RenderResult",imageSetDesc_00,(Surface *)local_f0,
                       (Surface *)&referenceImg.m_pixels.m_cap,
                       (RGBA *)&positions.
                                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       COMPARE_LOG_RESULT);
    if (bVar3) {
      if (bVar2) {
        local_308 = imageSetDesc.field_2._12_4_;
      }
      numRemaining = local_308 + numRemaining;
      local_234 = 0;
    }
    else {
      isLeftoverBatch = false;
      local_234 = 3;
    }
    std::__cxx11::string::~string((string *)local_128);
  } while (local_234 == 0);
  tcu::Surface::~Surface((Surface *)local_f0);
  tcu::Surface::~Surface((Surface *)&referenceImg.m_pixels.m_cap);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)local_b8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_88);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
            ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
             &fetchedPos.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
             &colors.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),isLeftoverBatch);
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindBuffer				(GL_ARRAY_BUFFER,			0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &positions[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &colors[0]);
		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_context.getRenderContext(), 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, &fetchedPos[0]);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, &fetchedColor[0]);
		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_context.getRenderContext(), 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_context.getTestContext().getLog(), "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	return isOk;
}